

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLCommonTest_sizeInBytesReferenceTest_Test::TestBody
          (OpenDDLCommonTest_sizeInBytesReferenceTest_Test *this)

{
  Text *this_00;
  Name *this_01;
  Reference *pRVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  size_t size;
  Name *name;
  
  this_00 = (Text *)operator_new(0x18);
  Text::Text(this_00,"test",4);
  this_01 = (Name *)operator_new(0x10);
  Name::Name(this_01,GlobalName,this_00);
  name = this_01;
  pRVar1 = (Reference *)operator_new(0x10);
  Reference::Reference(pRVar1,1,&name);
  size = Reference::sizeInBytes(pRVar1);
  local_48.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"4U","size",(uint *)&local_48,&size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Reference::~Reference(pRVar1);
  operator_delete(pRVar1,0x10);
  pRVar1 = (Reference *)operator_new(0x10);
  Reference::Reference(pRVar1,0,(Name **)0x0);
  size = Reference::sizeInBytes(pRVar1);
  local_48.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"0U","size",(uint *)&local_48,&size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Reference::~Reference(pRVar1);
  operator_delete(pRVar1,0x10);
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, sizeInBytesReferenceTest) {
    Text *id = new Text("test", 4);
    Name *name = new Name(GlobalName, id);
    Reference *ref1(new Reference(1, &name));
    size_t size(ref1->sizeInBytes());
    EXPECT_EQ(4U, size);
    delete ref1;

    Reference *ref2(new Reference(0, nullptr));
    size = ref2->sizeInBytes();
    EXPECT_EQ(0U, size);
    delete ref2;
}